

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

char * deqp::gls::getFloatUniformName(int number)

{
  char *pcStack_10;
  int number_local;
  
  switch(number) {
  case 0:
    pcStack_10 = "uf_zero";
    break;
  case 1:
    pcStack_10 = "uf_one";
    break;
  case 2:
    pcStack_10 = "uf_two";
    break;
  case 3:
    pcStack_10 = "uf_three";
    break;
  case 4:
    pcStack_10 = "uf_four";
    break;
  case 5:
    pcStack_10 = "uf_five";
    break;
  case 6:
    pcStack_10 = "uf_six";
    break;
  case 7:
    pcStack_10 = "uf_seven";
    break;
  case 8:
    pcStack_10 = "uf_eight";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* getFloatUniformName (int number)
{
	switch (number)
	{
		case 0:	return "uf_zero";
		case 1: return "uf_one";
		case 2: return "uf_two";
		case 3: return "uf_three";
		case 4: return "uf_four";
		case 5: return "uf_five";
		case 6: return "uf_six";
		case 7: return "uf_seven";
		case 8: return "uf_eight";
		default:
			DE_ASSERT(false);
			return "";
	}
}